

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsdCheck.c
# Opt level: O0

void Dsd_CheckCacheAllocate(int nEntries)

{
  int iVar1;
  Dsd_Entry_t *pDVar2;
  int nRequested;
  int nEntries_local;
  
  pCache = (Dds_Cache_t *)malloc(0x18);
  memset(pCache,0,0x18);
  iVar1 = Abc_PrimeCudd(nEntries);
  if (pCache->nTableSize != iVar1) {
    if (pCache->nTableSize != 0) {
      Dsd_CheckCacheDeallocate();
    }
    pCache->nTableSize = iVar1;
    pDVar2 = (Dsd_Entry_t *)malloc((long)iVar1 * 0x28);
    pCache->pTable = pDVar2;
  }
  Dsd_CheckCacheClear();
  return;
}

Assistant:

void Dsd_CheckCacheAllocate( int nEntries )
{
    int nRequested;

    pCache = ABC_ALLOC( Dds_Cache_t, 1 );
    memset( pCache, 0, sizeof(Dds_Cache_t) );

    // check what is the size of the current cache
    nRequested = Abc_PrimeCudd( nEntries );
    if ( pCache->nTableSize != nRequested )
    { // the current size is different
        // deallocate the old, allocate the new
        if ( pCache->nTableSize )
            Dsd_CheckCacheDeallocate();
        // allocate memory for the hash table
        pCache->nTableSize = nRequested;
        pCache->pTable = ABC_ALLOC( Dsd_Entry_t, nRequested );
    }
    // otherwise, there is no need to allocate, just clean
    Dsd_CheckCacheClear();
//  printf( "\nThe number of allocated cache entries = %d.\n\n", pCache->nTableSize );
}